

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O2

int __thiscall QuantNet::init(QuantNet *this,EVP_PKEY_CTX *ctx)

{
  string *__lhs;
  Layer *pLVar1;
  pointer piVar2;
  pointer piVar3;
  bool bVar4;
  undefined8 in_RAX;
  pointer ppLVar5;
  pointer ppLVar6;
  int iVar7;
  int i;
  long lVar8;
  size_type __new_size;
  undefined8 uStack_38;
  
  lVar8 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    ppLVar5 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar6 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((int)((ulong)((long)ppLVar6 - (long)ppLVar5) >> 3) <= lVar8) break;
    pLVar1 = ppLVar5[lVar8];
    bVar4 = std::operator==(&pLVar1->type,"Input");
    if (bVar4) {
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->input_blobs,
                 (pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    lVar8 = lVar8 + 1;
  }
  iVar7 = 0;
  do {
    uStack_38 = CONCAT44(iVar7,(undefined4)uStack_38);
    if ((int)((ulong)((long)ppLVar6 - (long)ppLVar5) >> 3) <= iVar7) {
      piVar2 = (this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar3 = (this->conv_layers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      __new_size = (size_type)
                   (int)((ulong)((long)(this->conv_bottom_blobs).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->conv_bottom_blobs).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 2);
      std::vector<QuantBlobStat,_std::allocator<QuantBlobStat>_>::resize
                (&this->quant_blob_stats,__new_size);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                (&this->weight_scales,(long)(int)((ulong)((long)piVar2 - (long)piVar3) >> 2));
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                (&this->bottom_blob_scales,__new_size);
      return 0;
    }
    pLVar1 = ppLVar5[iVar7];
    __lhs = &pLVar1->type;
    bVar4 = std::operator==(__lhs,"Convolution");
    if (bVar4) {
LAB_00125ef8:
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->conv_layers,(value_type_conflict3 *)((long)&uStack_38 + 4));
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->conv_bottom_blobs,
                 (pLVar1->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->conv_top_blobs,
                 (pLVar1->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
    }
    else {
      bVar4 = std::operator==(__lhs,"ConvolutionDepthWise");
      if (bVar4) goto LAB_00125ef8;
      bVar4 = std::operator==(__lhs,"InnerProduct");
      if (bVar4) goto LAB_00125ef8;
    }
    iVar7 = uStack_38._4_4_ + 1;
    ppLVar5 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppLVar6 = (this->layers->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

int QuantNet::init()
{
    // find all input layers
    for (int i = 0; i < (int)layers.size(); i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "Input")
        {
            input_blobs.push_back(layer->tops[0]);
        }
    }

    // find all conv layers
    for (int i = 0; i < (int)layers.size(); i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "Convolution" || layer->type == "ConvolutionDepthWise" || layer->type == "InnerProduct")
        {
            conv_layers.push_back(i);
            conv_bottom_blobs.push_back(layer->bottoms[0]);
            conv_top_blobs.push_back(layer->tops[0]);
        }
    }

    const int conv_layer_count = (int)conv_layers.size();
    const int conv_bottom_blob_count = (int)conv_bottom_blobs.size();

    quant_blob_stats.resize(conv_bottom_blob_count);
    weight_scales.resize(conv_layer_count);
    bottom_blob_scales.resize(conv_bottom_blob_count);

    return 0;
}